

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchWeapon(int weapNum)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  PClassActor **ppPVar4;
  size_t sVar5;
  FState *state_00;
  PClassAmmo **ppPVar6;
  AActor *pAVar7;
  FDecalTemplate *pFVar8;
  FDecalTemplate *decal;
  FState *state;
  int val;
  undefined1 local_5f0 [8];
  FStateDefinitions statedef;
  AActor *pAStack_5b0;
  bool patchedStates;
  AWeapon *info;
  BYTE dummy [1416];
  PClassActor *local_18;
  PClassActor *type;
  int result;
  int weapNum_local;
  
  local_18 = (PClassActor *)0x0;
  pAStack_5b0 = (AActor *)&info;
  statedef.StateArray.Count._3_1_ = 0;
  FStateDefinitions::FStateDefinitions((FStateDefinitions *)local_5f0);
  if (((-1 < weapNum) && (weapNum < 9)) &&
     (uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&WeaponNames), (uint)weapNum < uVar2)) {
    ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[](&WeaponNames,(long)weapNum);
    local_18 = *ppPVar4;
    if (local_18 != (PClassActor *)0x0) {
      pAStack_5b0 = GetDefaultByType(&local_18->super_PClass);
      DPrintf(4,"Weapon %d\n",(ulong)(uint)weapNum);
    }
  }
  if (local_18 == (PClassActor *)0x0) {
    Printf("Weapon %d out of range.\n",(ulong)(uint)weapNum);
  }
  while (iVar3 = GetLine(), iVar3 == 1) {
    state._0_4_ = atoi(Line2);
    sVar5 = strlen(Line1);
    pcVar1 = Line1;
    if (sVar5 < 9) {
      iVar3 = strcasecmp(Line1,"Decal");
      if (iVar3 == 0) {
        stripwhite(Line2);
        pFVar8 = FDecalLib::GetDecalByName(&DecalLibrary,Line2);
        if (pFVar8 == (FDecalTemplate *)0x0) {
          Printf("Weapon %d: Unknown decal %s\n",(ulong)(uint)weapNum,Line2);
        }
        else {
          pAStack_5b0->DecalGenerator = &pFVar8->super_FDecalBase;
        }
      }
      else {
        iVar3 = strcasecmp(Line1,"Ammo use");
        if ((iVar3 == 0) || (iVar3 = strcasecmp(Line1,"Ammo per shot"), iVar3 == 0)) {
          *(uint *)&pAStack_5b0[1].OldRenderPos.X = (uint)state;
          TFlags<ActorFlag6,_unsigned_int>::operator|=(&pAStack_5b0->flags6,MF6_INTRYMOVE);
        }
        else {
          iVar3 = strcasecmp(Line1,"Min ammo");
          if (iVar3 == 0) {
            *(uint *)&pAStack_5b0[1].__Pos.Z = (uint)state;
          }
          else {
            Printf(unknown_str,Line1,"Weapon",(ulong)(uint)weapNum);
          }
        }
      }
    }
    else {
      sVar5 = strlen(Line1);
      iVar3 = strcasecmp(pcVar1 + (sVar5 - 6)," frame");
      if (iVar3 == 0) {
        state_00 = FindState((uint)state);
        if ((local_18 != (PClassActor *)0x0) && ((statedef.StateArray.Count._3_1_ & 1) == 0)) {
          FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_5f0,local_18);
          statedef.StateArray.Count._3_1_ = 1;
        }
        iVar3 = strncasecmp(Line1,"Deselect",8);
        if (iVar3 == 0) {
          FStateDefinitions::SetStateLabel((FStateDefinitions *)local_5f0,"Select",state_00,'\x01');
        }
        else {
          iVar3 = strncasecmp(Line1,"Select",6);
          if (iVar3 == 0) {
            FStateDefinitions::SetStateLabel
                      ((FStateDefinitions *)local_5f0,"Deselect",state_00,'\x01');
          }
          else {
            iVar3 = strncasecmp(Line1,"Bobbing",7);
            if (iVar3 == 0) {
              FStateDefinitions::SetStateLabel
                        ((FStateDefinitions *)local_5f0,"Ready",state_00,'\x01');
            }
            else {
              iVar3 = strncasecmp(Line1,"Shooting",8);
              if (iVar3 == 0) {
                FStateDefinitions::SetStateLabel
                          ((FStateDefinitions *)local_5f0,"Fire",state_00,'\x01');
              }
              else {
                iVar3 = strncasecmp(Line1,"Firing",6);
                if (iVar3 == 0) {
                  FStateDefinitions::SetStateLabel
                            ((FStateDefinitions *)local_5f0,"Flash",state_00,'\x01');
                }
              }
            }
          }
        }
      }
      else {
        iVar3 = strcasecmp(Line1,"Ammo type");
        if (iVar3 == 0) {
          if ((((int)(uint)state < 0) || (0xb < (int)(uint)state)) ||
             (uVar2 = TArray<PClassAmmo_*,_PClassAmmo_*>::Size(&AmmoNames), uVar2 <= (uint)state)) {
            state._0_4_ = 5;
          }
          ppPVar6 = TArray<PClassAmmo_*,_PClassAmmo_*>::operator[]
                              (&AmmoNames,(long)(int)(uint)state);
          pAStack_5b0[1].sprev = (AActor **)*ppPVar6;
          if (pAStack_5b0[1].sprev != (AActor **)0x0) {
            pAVar7 = GetDefaultByType((PClass *)pAStack_5b0[1].sprev);
            *(int *)&pAStack_5b0[1].__Pos.Y =
                 *(int *)&pAVar7[1].super_DThinker.super_DObject.Class << 1;
            if (*(int *)&pAStack_5b0[1].OldRenderPos.X == 0) {
              *(undefined4 *)&pAStack_5b0[1].OldRenderPos.X = 1;
            }
          }
        }
        else {
          Printf(unknown_str,Line1,"Weapon",(ulong)(uint)weapNum);
        }
      }
    }
  }
  if (pAStack_5b0[1].sprev == (AActor **)0x0) {
    *(undefined4 *)&pAStack_5b0[1].OldRenderPos.X = 0;
  }
  if ((statedef.StateArray.Count._3_1_ & 1) != 0) {
    FStateDefinitions::InstallStates((FStateDefinitions *)local_5f0,local_18,pAStack_5b0);
  }
  FStateDefinitions::~FStateDefinitions((FStateDefinitions *)local_5f0);
  return iVar3;
}

Assistant:

static int PatchWeapon (int weapNum)
{
	int result;
	PClassActor *type = NULL;
	BYTE dummy[sizeof(AWeapon)];
	AWeapon *info = (AWeapon *)&dummy;
	bool patchedStates = false;
	FStateDefinitions statedef;

	if (weapNum >= 0 && weapNum < 9 && (unsigned)weapNum < WeaponNames.Size())
	{
		type = WeaponNames[weapNum];
		if (type != NULL)
		{
			info = (AWeapon *)GetDefaultByType (type);
			DPrintf (DMSG_SPAMMY, "Weapon %d\n", weapNum);
		}
	}

	if (type == NULL)
	{
		Printf ("Weapon %d out of range.\n", weapNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);

		if (strlen (Line1) >= 9)
		{
			if (stricmp (Line1 + strlen (Line1) - 6, " frame") == 0)
			{
				FState *state = FindState (val);

				if (type != NULL && !patchedStates)
				{
					statedef.MakeStateDefines(type);
					patchedStates = true;
				}

				if (strnicmp (Line1, "Deselect", 8) == 0)
					statedef.SetStateLabel("Select", state);
				else if (strnicmp (Line1, "Select", 6) == 0)
					statedef.SetStateLabel("Deselect", state);
				else if (strnicmp (Line1, "Bobbing", 7) == 0)
					statedef.SetStateLabel("Ready", state);
				else if (strnicmp (Line1, "Shooting", 8) == 0)
					statedef.SetStateLabel("Fire", state);
				else if (strnicmp (Line1, "Firing", 6) == 0)
					statedef.SetStateLabel("Flash", state);
			}
			else if (stricmp (Line1, "Ammo type") == 0)
			{
				if (val < 0 || val >= 12 || (unsigned)val >= AmmoNames.Size())
				{
					val = 5;
				}
				info->AmmoType1 = AmmoNames[val];
				if (info->AmmoType1 != NULL)
				{
					info->AmmoGive1 = ((AAmmo*)GetDefaultByType (info->AmmoType1))->Amount * 2;
					if (info->AmmoUse1 == 0)
					{
						info->AmmoUse1 = 1;
					}
				}
			}
			else
			{
				Printf (unknown_str, Line1, "Weapon", weapNum);
			}
		}
		else if (stricmp (Line1, "Decal") == 0)
		{
			stripwhite (Line2);
			const FDecalTemplate *decal = DecalLibrary.GetDecalByName (Line2);
			if (decal != NULL)
			{
				info->DecalGenerator = const_cast <FDecalTemplate *>(decal);
			}
			else
			{
				Printf ("Weapon %d: Unknown decal %s\n", weapNum, Line2);
			}
		}
		else if (stricmp (Line1, "Ammo use") == 0 || stricmp (Line1, "Ammo per shot") == 0)
		{
			info->AmmoUse1 = val;
			info->flags6 |= MF6_INTRYMOVE;	// flag the weapon for postprocessing (reuse a flag that can't be set by external means)
		}
		else if (stricmp (Line1, "Min ammo") == 0)
		{
			info->MinAmmo1 = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Weapon", weapNum);
		}
	}

	if (info->AmmoType1 == NULL)
	{
		info->AmmoUse1 = 0;
	}

	if (patchedStates)
	{
		statedef.InstallStates(type, info);
	}

	return result;
}